

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O3

void __thiscall PrintICT::visit(PrintICT *this,BINOP *node)

{
  ExprNode *pEVar1;
  char *aux;
  
  aux = token_id_to_name(node->binop);
  printLexemeIR(this,"BINOP",aux);
  this->level = this->level + 1;
  pEVar1 = node->left;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  pEVar1 = node->right;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintICT::visit(BINOP *node) {
    printLexemeIR("BINOP", token_id_to_name(node->getBinop()));
    up_level();
    if (node->getLeft() != NULL) node->getLeft()->accept(this);
    if (node->getRight() != NULL) node->getRight()->accept(this);
    down_level();
}